

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::AddSegs(FNodeBuilder *this,seg_t *segs,int numsegs)

{
  undefined8 *puVar1;
  DWORD DVar2;
  DWORD DVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  line_t_conflict *plVar7;
  FPrivVert *pFVar8;
  FPrivSeg *pFVar9;
  FPrivSeg *pFVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int local_80;
  undefined8 local_58 [2];
  sector_t_conflict *local_48;
  sector_t_conflict *psStack_40;
  
  if (0 < numsegs) {
    lVar13 = 0;
    do {
      puVar1 = (undefined8 *)((long)&segs->frontsector + lVar13);
      local_48 = (sector_t_conflict *)*puVar1;
      psStack_40 = (sector_t_conflict *)puVar1[1];
      pdVar5 = *(double **)((long)&segs->v1 + lVar13);
      local_58[0] = CONCAT44(SUB84(pdVar5[1] + 103079215104.0,0),SUB84(*pdVar5 + 103079215104.0,0));
      iVar11 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_58);
      pdVar5 = *(double **)((long)&segs->v2 + lVar13);
      local_58[0] = CONCAT44(SUB84(pdVar5[1] + 103079215104.0,0),SUB84(*pdVar5 + 103079215104.0,0));
      iVar12 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_58);
      lVar6 = *(long *)((long)&segs->sidedef + lVar13);
      if (lVar6 == 0) {
        local_80 = -1;
      }
      else {
        local_80 = (int)((ulong)(lVar6 - (long)this->Level->Sides) >> 6) * -0x55555555;
      }
      lVar6 = *(long *)((long)&segs->linedef + lVar13);
      plVar7 = this->Level->Lines;
      pFVar8 = (this->Vertices).Array;
      DVar2 = pFVar8[iVar11].segs;
      DVar3 = pFVar8[iVar12].segs2;
      TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
      pFVar9 = (this->Segs).Array;
      uVar4 = (this->Segs).Count;
      pFVar9[uVar4].v1 = iVar11;
      pFVar9[uVar4].v2 = iVar12;
      pFVar9[uVar4].sidedef = local_80;
      pFVar9[uVar4].linedef = (int)((ulong)(lVar6 - (long)plVar7) >> 3) * 0x286bca1b;
      pFVar9[uVar4].frontsector = local_48;
      (&pFVar9[uVar4].frontsector)[1] = psStack_40;
      pFVar9[uVar4].next = 0xffffffff;
      pFVar9[uVar4].nextforvert = DVar2;
      pFVar9[uVar4].nextforvert2 = DVar3;
      pFVar10 = pFVar9 + uVar4;
      pFVar10->loopnum = 0;
      pFVar10->partner = 0xffffffff;
      *(undefined8 *)(&pFVar10->loopnum + 2) = 0xffffffffffffffff;
      pFVar9[uVar4].planefront = false;
      pFVar9[uVar4].hashnext = (FPrivSeg *)0x0;
      uVar4 = (this->Segs).Count;
      (this->Segs).Count = uVar4 + 1;
      pFVar8 = (this->Vertices).Array;
      pFVar8[iVar11].segs = uVar4;
      pFVar8[iVar12].segs2 = uVar4;
      lVar13 = lVar13 + 0x30;
    } while ((ulong)(uint)numsegs * 0x30 != lVar13);
    return;
  }
  __assert_fail("numsegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                ,0xcf,"void FNodeBuilder::AddSegs(seg_t *, int)");
}

Assistant:

void FNodeBuilder::AddSegs(seg_t *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		seg.frontsector = segs[i].frontsector;
		seg.backsector = segs[i].backsector;
		vert.x = segs[i].v1->fixX();
		vert.y = segs[i].v1->fixY();
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = segs[i].v2->fixX();
		vert.y = segs[i].v2->fixY();
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(segs[i].linedef - Level.Lines);
		seg.sidedef = segs[i].sidedef != NULL ? int(segs[i].sidedef - Level.Sides) : int(NO_SIDE);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}